

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

uncertain_measurement units::root(uncertain_measurement *um,int power)

{
  double val;
  double dVar1;
  double dVar2;
  double dVar3;
  int local_5c;
  unit local_48;
  unit local_40;
  double local_38;
  double new_tol;
  double new_value;
  uncertain_measurement *puStack_20;
  int power_local;
  uncertain_measurement *um_local;
  
  new_value._4_4_ = power;
  puStack_20 = um;
  dVar1 = uncertain_measurement::value(um);
  dVar1 = numericalRoot<double>(dVar1,new_value._4_4_);
  new_tol = dVar1;
  dVar2 = uncertain_measurement::uncertainty(puStack_20);
  if (new_value._4_4_ < 0) {
    local_5c = -new_value._4_4_;
  }
  else {
    local_5c = new_value._4_4_;
  }
  dVar3 = uncertain_measurement::value(puStack_20);
  val = new_tol;
  dVar1 = (dVar1 * dVar2) / ((double)local_5c * dVar3);
  local_38 = dVar1;
  local_48 = uncertain_measurement::units(puStack_20);
  local_40 = root(&local_48,new_value._4_4_);
  uncertain_measurement::uncertain_measurement
            ((uncertain_measurement *)&um_local,val,dVar1,&local_40);
  return _um_local;
}

Assistant:

uncertain_measurement root(const uncertain_measurement& um, int power)
{
    auto new_value = numericalRoot(um.value(), power);
    auto new_tol = new_value * um.uncertainty() /
        (static_cast<double>((power >= 0) ? power : -power) * um.value());
    return uncertain_measurement(new_value, new_tol, root(um.units(), power));
}